

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void print_bb_insn(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn,int with_notes_p)

{
  MIR_context_t ctx;
  long *plVar1;
  dead_var_t_conflict pdVar2;
  MIR_op_t op_00;
  int iVar3;
  MIR_insn_t pMVar4;
  char *pcVar5;
  DLIST_dead_var_t *pDVar6;
  FILE *__stream;
  long *plVar7;
  size_t i;
  ulong uVar8;
  size_t nel;
  MIR_op_t op;
  bitmap_iterator_t bi;
  
  ctx = gen_ctx->ctx;
  print_insn(gen_ctx,bb_insn->insn,0);
  fwrite(" # indexes: ",0xc,1,(FILE *)gen_ctx->debug_file);
  uVar8 = 0;
  do {
    pMVar4 = bb_insn->insn;
    if (*(uint *)&pMVar4->field_0x1c <= uVar8) {
      if (with_notes_p != 0) {
        pDVar6 = &bb_insn->insn_dead_vars;
        while (pdVar2 = pDVar6->head, pdVar2 != (dead_var_t_conflict)0x0) {
          op._8_1_ = 2;
          pcVar5 = " ";
          op.u.reg = pdVar2->var;
          if (pdVar2 == (bb_insn->insn_dead_vars).head) {
            pcVar5 = " # dead: ";
          }
          fprintf((FILE *)gen_ctx->debug_file,pcVar5);
          op_00._9_7_ = op._9_7_;
          op_00._8_1_ = op._8_1_;
          op_00.u.mem.alias = op.u.mem.alias;
          op_00.u.reg = op.u.reg;
          op_00.data = op.data;
          op_00.u.str.s = op.u.str.s;
          op_00.u._16_8_ = op.u._16_8_;
          op_00.u.mem.disp = op.u.mem.disp;
          MIR_output_op(ctx,gen_ctx->debug_file,op_00,(gen_ctx->curr_func_item->u).func);
          pDVar6 = (DLIST_dead_var_t *)&(pdVar2->dead_var_link).next;
        }
        if (0xfffffffc < *(int *)&bb_insn->insn->field_0x18 - 0xaaU) {
          bi.bitmap = bb_insn->call_hard_reg_args;
          bi.nbit = 0;
          pcVar5 = " # call used: hr%ld";
          while( true ) {
            iVar3 = bitmap_iterator_next(&bi,&nel);
            if (iVar3 == 0) break;
            fprintf((FILE *)gen_ctx->debug_file,pcVar5,nel);
            pcVar5 = " hr%ld";
          }
        }
      }
      fputc(10,(FILE *)gen_ctx->debug_file);
      return;
    }
    if (uVar8 != 0) {
      fputc(0x2c,(FILE *)gen_ctx->debug_file);
      pMVar4 = bb_insn->insn;
    }
    plVar1 = (long *)pMVar4->ops[uVar8].data;
    if (plVar1 == (long *)0x0) {
      __stream = (FILE *)gen_ctx->debug_file;
      iVar3 = 0x5f;
LAB_00137e3c:
      fputc(iVar3,__stream);
    }
    else {
      plVar7 = plVar1;
      if ((bb_insn_t_conflict)plVar1[1] == bb_insn) {
        for (; __stream = (FILE *)gen_ctx->debug_file, plVar7 != (long *)0x0;
            plVar7 = (long *)plVar7[4]) {
          pcVar5 = ", ";
          if (plVar7 == plVar1) {
            pcVar5 = "(";
          }
          fprintf(__stream,"%s%d",pcVar5,(ulong)*(uint *)(*plVar7 + 0xc));
        }
        iVar3 = 0x29;
        goto LAB_00137e3c;
      }
      fprintf((FILE *)gen_ctx->debug_file,"%d",(ulong)((bb_insn_t_conflict)plVar1[1])->index);
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

static void print_bb_insn (gen_ctx_t gen_ctx, bb_insn_t bb_insn, int with_notes_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_op_t op;
  int first_p;
  size_t nel;
  bitmap_iterator_t bi;

  print_insn (gen_ctx, bb_insn->insn, FALSE);
  fprintf (debug_file, " # indexes: ");
  for (size_t i = 0; i < bb_insn->insn->nops; i++) {
    if (i != 0) fprintf (debug_file, ",");
    print_op_data (gen_ctx, bb_insn->insn->ops[i].data, bb_insn);
  }
  if (with_notes_p) {
    for (dead_var_t dv = DLIST_HEAD (dead_var_t, bb_insn->insn_dead_vars); dv != NULL;
         dv = DLIST_NEXT (dead_var_t, dv)) {
      op.mode = MIR_OP_VAR;
      op.u.var = dv->var;
      fprintf (debug_file,
               dv == DLIST_HEAD (dead_var_t, bb_insn->insn_dead_vars) ? " # dead: " : " ");
      MIR_output_op (ctx, debug_file, op, curr_func_item->u.func);
    }
    if (MIR_call_code_p (bb_insn->insn->code)) {
      first_p = TRUE;
      FOREACH_BITMAP_BIT (bi, bb_insn->call_hard_reg_args, nel) {
        fprintf (debug_file, first_p ? " # call used: hr%ld" : " hr%ld", (unsigned long) nel);
        first_p = FALSE;
      }
    }
  }
  fprintf (debug_file, "\n");
}